

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b1wc.c
# Opt level: O1

void set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  
  dVar1 = get_ext_param(p,ext_params,0);
  *p->mix_coef = 1.0 - dVar1;
  p->cam_alpha = dVar1;
  return;
}

Assistant:

static void
set_ext_params(xc_func_type *p, const double *ext_params)
{
  double cx;

  assert(p != NULL);

  cx = get_ext_param(p, ext_params, 0);

  p->mix_coef[0] = 1-cx;

  p->cam_alpha = cx;
  p->cam_omega = 0.0;
}